

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::longest_vline(Fl_Text_Display *this)

{
  int i2;
  int local_18;
  int local_14;
  int i;
  int longest;
  Fl_Text_Display *this_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < this->mNVisibleLines; local_18 = local_18 + 1) {
    i2 = measure_vline(this,local_18);
    local_14 = max(local_14,i2);
  }
  return local_14;
}

Assistant:

int Fl_Text_Display::longest_vline() const {
  int longest = 0;
  for (int i = 0; i < mNVisibleLines; i++)
    longest = max(longest, measure_vline(i));
  return longest;
}